

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_gmf.cpp
# Opt level: O0

bool midi_processor::process_gmf
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,midi_container *p_out)

{
  value_type vVar1;
  const_reference pvVar2;
  const_iterator end;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_120;
  const_iterator local_118;
  const_iterator it;
  midi_event local_d0;
  midi_event local_80;
  undefined1 local_40 [8];
  midi_track track;
  uint32_t tempo_scaled;
  uint16_t tempo;
  uint8_t buffer [10];
  midi_container *p_out_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file_local;
  
  midi_container::initialize(p_out,0,0xc0);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,4);
  vVar1 = *pvVar2;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,5);
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_2_ = CONCAT11(vVar1,*pvVar2);
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ =
       (uint)track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_2_ * 100000;
  midi_track::midi_track((midi_track *)local_40);
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0xff;
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0x51;
  midi_event::midi_event
            (&local_80,0,extended,0,
             (uint8_t *)
             ((long)&track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 6),5);
  midi_track::add_event((midi_track *)local_40,&local_80);
  midi_event::~midi_event(&local_80);
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0xf0;
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0x41;
  midi_event::midi_event
            (&local_d0,0,extended,0,
             (uint8_t *)
             ((long)&track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 6),10);
  midi_track::add_event((midi_track *)local_40,&local_d0);
  midi_event::~midi_event(&local_d0);
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0xff;
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0x2f;
  midi_event::midi_event
            ((midi_event *)&it,0,extended,0,
             (uint8_t *)
             ((long)&track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 6),2);
  midi_track::add_event((midi_track *)local_40,(midi_event *)&it);
  midi_event::~midi_event((midi_event *)&it);
  midi_container::add_track(p_out,(midi_track *)local_40);
  local_120._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(p_file);
  local_118._M_current =
       (uchar *)__gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_120,7);
  end = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(p_file);
  process_standard_midi_track(&local_118,end,p_out,true);
  midi_track::~midi_track((midi_track *)local_40);
  return true;
}

Assistant:

bool midi_processor::process_gmf( std::vector<uint8_t> const& p_file, midi_container & p_out )
{
    uint8_t buffer[10];

    p_out.initialize( 0, 0xC0 );

    uint16_t tempo = ( p_file[ 4 ] << 8 ) | p_file[ 5 ];
    uint32_t tempo_scaled = tempo * 100000;

    midi_track track;

    buffer[0] = 0xFF;
    buffer[1] = 0x51;
    buffer[2] = tempo_scaled >> 16;
    buffer[3] = tempo_scaled >> 8;
    buffer[4] = tempo_scaled;

    track.add_event( midi_event( 0, midi_event::extended, 0, buffer, 5 ) );

    buffer[0] = 0xF0;
    buffer[1] = 0x41;
    buffer[2] = 0x10;
    buffer[3] = 0x16;
    buffer[4] = 0x12;
    buffer[5] = 0x7F;
    buffer[6] = 0x00;
    buffer[7] = 0x00;
    buffer[8] = 0x01;
    buffer[9] = 0xF7;

    track.add_event( midi_event( 0, midi_event::extended, 0, buffer, 10 ) );

    buffer[0] = 0xFF;
    buffer[1] = 0x2F;

    track.add_event( midi_event( 0, midi_event::extended, 0, buffer, 2 ) );

    p_out.add_track( track );

    std::vector<uint8_t>::const_iterator it = p_file.begin() + 7;

    process_standard_midi_track( it, p_file.end(), p_out, true );
    
    return true;
}